

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O2

long computeDifferences(char *s1,char *s2,unsigned_long L,char matchMode,Vector *result,
                       sequence_gap_structure *sequence_descriptor1,
                       sequence_gap_structure *sequence_descriptor2)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (sequence_descriptor2 != (sequence_gap_structure *)0x0 &&
      sequence_descriptor1 != (sequence_gap_structure *)0x0) {
    uVar3 = sequence_descriptor2->first_nongap;
    if (sequence_descriptor1->first_nongap < sequence_descriptor2->first_nongap) {
      uVar3 = sequence_descriptor1->first_nongap;
    }
    uVar4 = sequence_descriptor2->last_nongap;
    if (sequence_descriptor2->last_nongap < sequence_descriptor1->last_nongap) {
      uVar4 = sequence_descriptor1->last_nongap;
    }
    if (matchMode == '\x06') {
      lVar2 = uVar3 << 8;
      for (; uVar3 < uVar4; uVar3 = uVar3 + 1) {
        cVar1 = s2[uVar3];
        if ((s1[uVar3] != cVar1) && (s1[uVar3] != '\x0f' && cVar1 != '\x0f')) {
          Vector::appendValue(result,(ulong)(uint)(int)cVar1 + lVar2);
        }
        lVar2 = lVar2 + 0x100;
      }
    }
    else if (matchMode == '\x05') {
      lVar2 = uVar3 << 8;
      for (; uVar3 < uVar4; uVar3 = uVar3 + 1) {
        if (s1[uVar3] != s2[uVar3]) {
          Vector::appendValue(result,(ulong)(uint)(int)s2[uVar3] + lVar2);
        }
        lVar2 = lVar2 + 0x100;
      }
    }
  }
  return result->vLength;
}

Assistant:

long        computeDifferences (const char * __restrict__ s1,
                                const char * __restrict__ s2,
                                const unsigned long L,
                                const char matchMode,
                                Vector & result,
                                const sequence_gap_structure * sequence_descriptor1,
                                const sequence_gap_structure * sequence_descriptor2) {
    

    if (sequence_descriptor1 && sequence_descriptor2) {
      
      unsigned long first_nongap = MIN  (sequence_descriptor1->first_nongap,   sequence_descriptor2->first_nongap),
                    last_nongap  = MAX  (sequence_descriptor1->last_nongap,    sequence_descriptor2->last_nongap);
//#pragma omp critical
//      cout << first_nongap << " " << last_nongap << " " << span_start << " " << span_end << endl;
        
      if (matchMode == INFORMATIVE) {
          for (long p = first_nongap; p < last_nongap; p++) {
              unsigned c1 = s1[p],
                       c2 = s2[p];
              
              if (c1 != c2) {
                  if (c2 != N_CHAR && c1 != N_CHAR) {
                      result.appendValue(pack_difference(p,c2));
                  }
              }
          }
      } else if (matchMode == MISMATCH) {
          for (long p = first_nongap; p < last_nongap; p++) {
              unsigned c1 = s1[p],
                       c2 = s2[p];
              
              if (c1 != c2) {
                  result.appendValue(pack_difference(p,c2));
              }
          }
      }
    }
    
    return result.length();
}